

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

Logger * __thiscall higan::Logger::operator<<(Logger *this,char *str)

{
  int iVar1;
  char *__s;
  size_t __maxlen;
  char *str_local;
  Logger *this_local;
  
  __s = TinyBuffer::WriteBegin(&this->buffer_);
  __maxlen = TinyBuffer::ReadableSize(&this->buffer_);
  iVar1 = snprintf(__s,__maxlen,"%s",str);
  TinyBuffer::AddWriteIndex(&this->buffer_,(long)iVar1);
  return this;
}

Assistant:

Logger& Logger::operator<<(const char* str)
{
	buffer_.AddWriteIndex(snprintf(buffer_. WriteBegin(), buffer_.ReadableSize(),
			"%s", str));

	return *this;
}